

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool llbuild::buildsystem::pathIsPrefixedByPath(string *path,string *prefixPath)

{
  pointer pcVar1;
  __type _Var2;
  long lVar3;
  bool bVar4;
  pair<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar5;
  string pathSeparators;
  undefined1 local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  llbuild::basic::sys::getPathSeparators_abi_cxx11_();
  if (path->_M_string_length < prefixPath->_M_string_length) {
    bVar4 = false;
    std::__cxx11::string::substr((ulong)&local_40,(ulong)prefixPath);
    _Var2 = std::operator==(&local_40,path);
    if (_Var2) {
      lVar3 = std::__cxx11::string::find
                        ((char)local_60,
                         (ulong)(uint)(int)(prefixPath->_M_dataplus)._M_p
                                           [prefixPath->_M_string_length - 1]);
      bVar4 = lVar3 != -1;
    }
    std::__cxx11::string::_M_dispose();
  }
  else {
    pcVar1 = (prefixPath->_M_dataplus)._M_p;
    pVar5 = std::
            __mismatch<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (pcVar1,pcVar1 + prefixPath->_M_string_length,(path->_M_dataplus)._M_p);
    if (pVar5.first._M_current._M_current !=
        (prefixPath->_M_dataplus)._M_p + prefixPath->_M_string_length) {
      bVar4 = false;
      lVar3 = std::__cxx11::string::find
                        ((char)local_60,(ulong)(uint)(int)*pVar5.first._M_current._M_current);
      if (lVar3 == -1) goto LAB_00134c42;
    }
    if (pVar5.second._M_current._M_current == (path->_M_dataplus)._M_p + path->_M_string_length) {
      bVar4 = true;
    }
    else {
      lVar3 = std::__cxx11::string::find
                        ((char)local_60,(ulong)(uint)(int)*pVar5.second._M_current._M_current);
      bVar4 = lVar3 != -1;
    }
  }
LAB_00134c42:
  std::__cxx11::string::_M_dispose();
  return bVar4;
}

Assistant:

bool llbuild::buildsystem::pathIsPrefixedByPath(std::string path,
                                                std::string prefixPath) {
  std::string pathSeparators = llbuild::basic::sys::getPathSeparators();
  // Note: GCC 4.8 doesn't support the mismatch(first1, last1, first2, last2)
  // overload, just mismatch(first1, last1, first2), so we have to handle the
  // case where prefixPath is longer than path.
  if (prefixPath.length() > path.length()) {
    // The only case where the prefix can be longer and still be a valid prefix
    // is "/foo/" is a prefix of "/foo"
    return prefixPath.substr(0, prefixPath.length() - 1) == path &&
           pathSeparators.find(prefixPath[prefixPath.length() - 1]) !=
               std::string::npos;
  }
  auto res = std::mismatch(prefixPath.begin(), prefixPath.end(), path.begin());
  // Check if `prefixPath` has been exhausted or just a separator remains.
  bool isPrefix = res.first == prefixPath.end() ||
                  (pathSeparators.find(*(res.first++)) != std::string::npos);
  // Check if `path` has been exhausted or just a separator remains.
  return isPrefix &&
         (res.second == path.end() ||
          (pathSeparators.find(*(res.second++)) != std::string::npos));
}